

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

uint __thiscall libmatroska::KaxBlockGroup::ReferenceCount(KaxBlockGroup *this)

{
  EbmlElement *local_20;
  KaxReferenceBlock *MyBlockAdds;
  uint Result;
  KaxBlockGroup *this_local;
  
  MyBlockAdds._4_4_ = 0;
  local_20 = libebml::EbmlMaster::FindFirstElt
                       (&this->super_EbmlMaster,(EbmlCallbacks *)KaxReferenceBlock::ClassInfos);
  if (local_20 != (EbmlElement *)0x0) {
    MyBlockAdds._4_4_ = 1;
    while (local_20 = libebml::EbmlMaster::FindNextElt(&this->super_EbmlMaster,local_20),
          local_20 != (EbmlElement *)0x0) {
      MyBlockAdds._4_4_ = MyBlockAdds._4_4_ + 1;
    }
  }
  return MyBlockAdds._4_4_;
}

Assistant:

unsigned int KaxBlockGroup::ReferenceCount() const
{
  unsigned int Result = 0;
  KaxReferenceBlock * MyBlockAdds = static_cast<KaxReferenceBlock *>(FindFirstElt(EBML_INFO(KaxReferenceBlock)));
  if (MyBlockAdds != NULL) {
    Result++;
    while ((MyBlockAdds = static_cast<KaxReferenceBlock *>(FindNextElt(*MyBlockAdds))) != NULL) {
      Result++;
    }
  }
  return Result;
}